

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_75d24::CpuAbsoluteIndexedTest_eor_absy_without_page_crossing_Test::
~CpuAbsoluteIndexedTest_eor_absy_without_page_crossing_Test
          (CpuAbsoluteIndexedTest_eor_absy_without_page_crossing_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest((CpuTest *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, eor_absy_without_page_crossing) {
    registers.a = 0b00111100;
    registers.p = Z_FLAG | N_FLAG;
    expected.a = 0b10011001;
    expected.p = N_FLAG;
    memory_content = 0b10100101;

    run_read_instruction_without_pagecrossing(EOR_ABSY, IndexReg::Y);
}